

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  pointer *__x;
  long lVar1;
  pointer pcVar2;
  istream *piVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  size_type *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  istringstream local_458 [8];
  istringstream f;
  ostream local_448 [104];
  ios_base local_3e0 [8];
  ios_base local_3d8 [264];
  long *local_2d0;
  stringstream ss;
  long local_2c0;
  long lStack_2b8;
  byte abStack_2b0 [96];
  ios_base local_250 [392];
  MaterialFileReader *local_c8;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *local_c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_b8;
  string *local_b0;
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string s;
  string filepath;
  string filepath_1;
  
  local_c0 = materials;
  local_b8 = matMap;
  if ((this->m_mtlBaseDir)._M_string_length == 0) {
    pcVar2 = (matId->_M_dataplus)._M_p;
    psVar8 = warn;
    filepath.field_2._8_8_ = &filepath_1._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&filepath.field_2 + 8),pcVar2,pcVar2 + matId->_M_string_length);
    std::ifstream::ifstream(&local_2d0,(char *)filepath.field_2._8_8_,_S_in);
    bVar11 = (abStack_2b0[local_2d0[-3]] & 5) == 0;
    if (bVar11) {
      LoadMtl(local_b8,local_c0,(istream *)&local_2d0,warn,psVar8);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_458);
      std::__ostream_insert<char,std::char_traits<char>>(local_448,"Material file [ ",0x10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_448,(char *)filepath.field_2._8_8_,(long)filepath_1._M_dataplus._M_p
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ] not found in a path : ",0x19);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(this->m_mtlBaseDir)._M_dataplus._M_p,
                          (this->m_mtlBaseDir)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (warn != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append
                  ((char *)warn,
                   (ulong)paths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (paths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&s._M_string_length) {
          operator_delete(paths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          CONCAT71(s._M_string_length._1_7_,(undefined1)s._M_string_length) + 1);
        }
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_458);
      std::ios_base::~ios_base(local_3d8);
    }
    std::ifstream::~ifstream(&local_2d0);
    if ((size_type *)filepath.field_2._8_8_ != &filepath_1._M_string_length) {
      operator_delete((void *)filepath.field_2._8_8_,
                      CONCAT62(filepath_1._M_string_length._2_6_,
                               (undefined2)filepath_1._M_string_length) + 1);
    }
  }
  else {
    auStack_a8 = (undefined1  [8])0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar8 = warn;
    local_c8 = this;
    std::__cxx11::istringstream::istringstream(local_458,(string *)&this->m_mtlBaseDir,_S_in);
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&s._M_string_length;
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length._0_1_ = 0;
    __x = &paths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_458,(string *)__x,':');
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_a8,(value_type *)__x);
    }
    bVar11 = (undefined1  [8])
             paths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != auStack_a8;
    local_b0 = warn;
    if (bVar11) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        lVar1 = *(long *)((long)((long)auStack_a8 + 8) + lVar9);
        if (lVar1 == 0) {
          s.field_2._8_8_ = &filepath._M_string_length;
          pcVar2 = (matId->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&s.field_2 + 8),pcVar2,pcVar2 + matId->_M_string_length);
        }
        else {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&((_Alloc_hider *)auStack_a8)->_M_p + lVar9);
          if ((__lhs->_M_dataplus)._M_p[lVar1 + -1] == '/') {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&s.field_2 + 8),__lhs,matId);
          }
          else {
            filepath.field_2._8_8_ = &filepath_1._M_string_length;
            filepath_1._M_string_length._0_2_ = 0x2f;
            filepath_1._M_dataplus._M_p = (pointer)0x1;
            psVar8 = (string *)__lhs->_M_string_length;
            plVar4 = (long *)std::__cxx11::string::replace
                                       ((ulong)((long)&filepath.field_2 + 8),0,(char *)0x0,
                                        (ulong)(__lhs->_M_dataplus)._M_p);
            local_2d0 = &local_2c0;
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_2c0 = *plVar6;
              lStack_2b8 = plVar4[3];
            }
            else {
              local_2c0 = *plVar6;
              local_2d0 = (long *)*plVar4;
            }
            _ss = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_2d0,(ulong)(matId->_M_dataplus)._M_p);
            s.field_2._8_8_ = &filepath._M_string_length;
            psVar7 = (size_type *)(plVar4 + 2);
            if ((size_type *)*plVar4 == psVar7) {
              filepath._M_string_length = *psVar7;
              filepath.field_2._M_allocated_capacity = plVar4[3];
            }
            else {
              filepath._M_string_length = *psVar7;
              s.field_2._8_8_ = (size_type *)*plVar4;
            }
            filepath._M_dataplus._M_p = (pointer)plVar4[1];
            *plVar4 = (long)psVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            if (local_2d0 != &local_2c0) {
              operator_delete(local_2d0,local_2c0 + 1);
            }
            if ((size_type *)filepath.field_2._8_8_ != &filepath_1._M_string_length) {
              operator_delete((void *)filepath.field_2._8_8_,
                              CONCAT62(filepath_1._M_string_length._2_6_,
                                       (undefined2)filepath_1._M_string_length) + 1);
            }
          }
        }
        std::ifstream::ifstream(&local_2d0,(char *)s.field_2._8_8_,_S_in);
        if ((abStack_2b0[local_2d0[-3]] & 5) == 0) {
          LoadMtl(local_b8,local_c0,(istream *)&local_2d0,local_b0,psVar8);
          std::ifstream::~ifstream(&local_2d0);
          if ((size_type *)s.field_2._8_8_ != &filepath._M_string_length) {
            operator_delete((void *)s.field_2._8_8_,filepath._M_string_length + 1);
          }
          goto LAB_00113499;
        }
        std::ifstream::~ifstream(&local_2d0);
        if ((size_type *)s.field_2._8_8_ != &filepath._M_string_length) {
          operator_delete((void *)s.field_2._8_8_,filepath._M_string_length + 1);
        }
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x20;
        bVar11 = uVar10 < (ulong)((long)paths.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8
                                 >> 5);
      } while (bVar11);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&local_2d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2c0,"Material file [ ",0x10);
    psVar8 = local_b0;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2c0,(matId->_M_dataplus)._M_p,matId->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ] not found in a path : ",0x19);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(local_c8->m_mtlBaseDir)._M_dataplus._M_p,
                        (local_c8->m_mtlBaseDir)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (psVar8 != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)psVar8,filepath.field_2._8_8_);
      if ((size_type *)filepath.field_2._8_8_ != &filepath_1._M_string_length) {
        operator_delete((void *)filepath.field_2._8_8_,
                        CONCAT62(filepath_1._M_string_length._2_6_,
                                 (undefined2)filepath_1._M_string_length) + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_2d0);
    std::ios_base::~ios_base(local_250);
LAB_00113499:
    if (paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&s._M_string_length) {
      operator_delete(paths.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      CONCAT71(s._M_string_length._1_7_,(undefined1)s._M_string_length) + 1);
    }
    std::__cxx11::istringstream::~istringstream(local_458);
    std::ios_base::~ios_base(local_3e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_a8);
  }
  return bVar11;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *warn, std::string *err) {
  if (!m_mtlBaseDir.empty()) {
#ifdef _WIN32
    char sep = ';';
#else
    char sep = ':';
#endif

    // https://stackoverflow.com/questions/5167625/splitting-a-c-stdstring-using-tokens-e-g
    std::vector<std::string> paths;
    std::istringstream f(m_mtlBaseDir);

    std::string s;
    while (getline(f, s, sep)) {
      paths.push_back(s);
    }

    for (size_t i = 0; i < paths.size(); i++) {
      std::string filepath = JoinPath(paths[i], matId);

      std::ifstream matIStream(filepath.c_str());
      if (matIStream) {
        LoadMtl(matMap, materials, &matIStream, warn, err);

        return true;
      }
    }

    std::stringstream ss;
    ss << "Material file [ " << matId
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;

  } else {
    std::string filepath = matId;
    std::ifstream matIStream(filepath.c_str());
    if (matIStream) {
      LoadMtl(matMap, materials, &matIStream, warn, err);

      return true;
    }

    std::stringstream ss;
    ss << "Material file [ " << filepath
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }

    return false;
  }
}